

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O0

void __thiscall ANN::fit(ANN *this,MatrixXd *X,MatrixXd *y)

{
  size_type sVar1;
  reference ppLVar2;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDI;
  int i;
  MatrixXd error;
  MatrixXd predicted;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_ffffffffffffff18;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffff20;
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff40;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff48;
  undefined1 local_a8 [28];
  int local_8c;
  MatrixXd *in_stack_ffffffffffffffa0;
  ANN *in_stack_ffffffffffffffa8;
  
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (in_stack_ffffffffffffff20,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffff18);
  predict(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14d8c9);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transposeInPlace(in_RDI);
  sVar1 = std::vector<Layer_*,_std::allocator<Layer_*>_>::size
                    ((vector<Layer_*,_std::allocator<Layer_*>_> *)in_RDI);
  local_8c = (int)sVar1;
  while (local_8c = local_8c + -1, 0 < local_8c) {
    ppLVar2 = std::vector<Layer_*,_std::allocator<Layer_*>_>::operator[]
                        ((vector<Layer_*,_std::allocator<Layer_*>_> *)in_RDI,(long)local_8c);
    this_00 = (Matrix<double,__1,__1,_0,__1,__1> *)*ppLVar2;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              (this_00,(Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffff18);
    (*(code *)(this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_data[1])(local_a8,this_00,&stack0xffffffffffffff40);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
              (this_00,(Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffff18);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14d977)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14d981)
    ;
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14da0a);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14da17);
  return;
}

Assistant:

void ANN::fit(Eigen::MatrixXd X, Eigen::MatrixXd y) {
    // Calculate feed forward for X
    Eigen::MatrixXd predicted = predict(X);
    // Calculate error for output
    Eigen::MatrixXd error = y - predicted;
    error.transposeInPlace();
    // Backpropagate error
    for(int i = layers.size()-1; i > 0; i--) {
        error = layers[i]->backward(error);
    }
}